

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

char * host_ca_delete(char *name)

{
  int iVar1;
  char *__filename;
  char *local_30;
  char *err;
  _Bool bad;
  char *filename;
  char *name_local;
  
  if (*name == '\0') {
    name_local = dupstr("CA record must have a name");
  }
  else {
    __filename = make_filename(7,name);
    iVar1 = remove(__filename);
    local_30 = (char *)0x0;
    if (iVar1 < 0) {
      local_30 = dupprintf("Unable to delete file \'%s\'",__filename);
    }
    safefree(__filename);
    name_local = local_30;
  }
  return name_local;
}

Assistant:

char *host_ca_delete(const char *name)
{
    if (!*name)
        return dupstr("CA record must have a name");
    char *filename = make_filename(INDEX_HOSTCA, name);
    bool bad = remove(filename) < 0;

    char *err = NULL;
    if (bad)
        err = dupprintf("Unable to delete file '%s'", filename);

    sfree(filename);
    return err;
}